

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializationWrapper.cpp
# Opt level: O2

void fs_register_field(void *serializer,char *name,int name_length,char *data_type,
                      int data_type_length,int bytes_per_element,int isize,int jsize,int ksize,
                      int lsize,int iminushalo,int iplushalo,int jminushalo,int jplushalo,
                      int kminushalo,int kplushalo,int lminushalo,int lplushalo)

{
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,name,name + name_length);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,data_type,data_type + data_type_length);
  ser::Serializer::RegisterField
            ((Serializer *)serializer,&local_50,&local_70,bytes_per_element,isize,jsize,ksize,lsize,
             iminushalo,iplushalo,jminushalo,jplushalo,kminushalo,kplushalo,lminushalo,lplushalo);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void fs_register_field(void* serializer, const char* name, int name_length,
                       const char* data_type, int data_type_length, int bytes_per_element,
                       int isize, int jsize, int ksize, int lsize,
                       int iminushalo, int iplushalo, int jminushalo, int jplushalo,
                       int kminushalo, int kplushalo, int lminushalo, int lplushalo)
{
    reinterpret_cast<Serializer*>(serializer)->RegisterField(
                         std::string(name, name_length), std::string(data_type, data_type_length),
                         bytes_per_element, isize, jsize, ksize, lsize,
                         iminushalo, iplushalo, jminushalo, jplushalo,
                         kminushalo, kplushalo, lminushalo, lplushalo);
}